

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_shader.cpp
# Opt level: O0

void __thiscall FShaderManager::CompileShaders(FShaderManager *this)

{
  bool bVar1;
  uint uVar2;
  FString *pFVar3;
  char *pcVar4;
  char *ShaderPath;
  FShader *this_00;
  FShader *eff;
  FShader *pFStack_58;
  int i_3;
  FShader *shc_2;
  FName local_3c;
  FName sfn;
  FString name;
  FShader *pFStack_28;
  uint i_2;
  FShader *shc_1;
  FShader *shc;
  int i_1;
  int i;
  FShaderManager *this_local;
  
  this->mActiveShader = (FShader *)0x0;
  _i_1 = this;
  TArray<FShader_*,_FShader_*>::Clear(&this->mTextureEffects);
  TArray<FShader_*,_FShader_*>::Clear(&this->mTextureEffectsNAT);
  for (shc._4_4_ = 0; shc._4_4_ < 4; shc._4_4_ = shc._4_4_ + 1) {
    this->mEffectShaders[shc._4_4_] = (FShader *)0x0;
  }
  shc._0_4_ = 0;
  while (defaultshaders[(int)shc].ShaderName != (char *)0x0) {
    shc_1 = Compile(this,defaultshaders[(int)shc].ShaderName,defaultshaders[(int)shc].gettexelfunc,
                    true);
    TArray<FShader_*,_FShader_*>::Push(&this->mTextureEffects,&shc_1);
    if ((int)shc < 4) {
      pFStack_28 = Compile(this,defaultshaders[(int)shc].ShaderName,
                           defaultshaders[(int)shc].gettexelfunc,false);
      TArray<FShader_*,_FShader_*>::Push(&this->mTextureEffectsNAT,&stack0xffffffffffffffd8);
    }
    shc._0_4_ = (int)shc + 1;
  }
  for (name.Chars._4_4_ = 0; uVar2 = TArray<FString,_FString>::Size(&usershaders),
      name.Chars._4_4_ < uVar2; name.Chars._4_4_ = name.Chars._4_4_ + 1) {
    pFVar3 = TArray<FString,_FString>::operator[](&usershaders,(ulong)name.Chars._4_4_);
    pcVar4 = FString::operator_cast_to_char_(pFVar3);
    ExtractFileBase((char *)&stack0xffffffffffffffc8,SUB81(pcVar4,0));
    FName::FName(&local_3c,(FString *)&stack0xffffffffffffffc8);
    pcVar4 = FName::operator_cast_to_char_(&local_3c);
    pFVar3 = TArray<FString,_FString>::operator[](&usershaders,(ulong)name.Chars._4_4_);
    ShaderPath = FString::operator_cast_to_char_(pFVar3);
    pFStack_58 = Compile(this,pcVar4,ShaderPath,true);
    TArray<FShader_*,_FShader_*>::Push(&this->mTextureEffects,&stack0xffffffffffffffa8);
    FString::~FString((FString *)&stack0xffffffffffffffc8);
  }
  for (eff._4_4_ = 0; eff._4_4_ < 4; eff._4_4_ = eff._4_4_ + 1) {
    this_00 = (FShader *)operator_new(0x110);
    FShader::FShader(this_00,effectshaders[eff._4_4_].ShaderName);
    bVar1 = FShader::Load(this_00,effectshaders[eff._4_4_].ShaderName,effectshaders[eff._4_4_].vp,
                          effectshaders[eff._4_4_].fp1,effectshaders[eff._4_4_].fp2,
                          effectshaders[eff._4_4_].defines);
    if (bVar1) {
      this->mEffectShaders[eff._4_4_] = this_00;
    }
    else if (this_00 != (FShader *)0x0) {
      FShader::~FShader(this_00);
      operator_delete(this_00,0x110);
    }
  }
  return;
}

Assistant:

void FShaderManager::CompileShaders()
{
	mActiveShader = NULL;

	mTextureEffects.Clear();
	mTextureEffectsNAT.Clear();
	for (int i = 0; i < MAX_EFFECTS; i++)
	{
		mEffectShaders[i] = NULL;
	}

	for(int i=0;defaultshaders[i].ShaderName != NULL;i++)
	{
		FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, true);
		mTextureEffects.Push(shc);
		if (i <= 3)
		{
			FShader *shc = Compile(defaultshaders[i].ShaderName, defaultshaders[i].gettexelfunc, false);
			mTextureEffectsNAT.Push(shc);
		}
	}

	for(unsigned i = 0; i < usershaders.Size(); i++)
	{
		FString name = ExtractFileBase(usershaders[i]);
		FName sfn = name;

		FShader *shc = Compile(sfn, usershaders[i], true);
		mTextureEffects.Push(shc);
	}

	for(int i=0;i<MAX_EFFECTS;i++)
	{
		FShader *eff = new FShader(effectshaders[i].ShaderName);
		if (!eff->Load(effectshaders[i].ShaderName, effectshaders[i].vp, effectshaders[i].fp1,
						effectshaders[i].fp2, effectshaders[i].defines))
		{
			delete eff;
		}
		else mEffectShaders[i] = eff;
	}
}